

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateSymbolName
          (DescriptorBuilder *this,string *name,string *full_name,Message *proto)

{
  Message *pMVar1;
  Message *pMVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  int i;
  allocator<char> local_49;
  string local_48;
  Message *local_28;
  Message *proto_local;
  string *full_name_local;
  string *name_local;
  DescriptorBuilder *this_local;
  
  local_28 = proto;
  proto_local = (Message *)full_name;
  full_name_local = name;
  name_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  pMVar2 = proto_local;
  pMVar1 = local_28;
  if ((uVar3 & 1) == 0) {
    for (local_60 = 0; uVar3 = (ulong)local_60, uVar4 = std::__cxx11::string::size(), uVar3 < uVar4;
        local_60 = local_60 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local);
      if ((((*pcVar5 < 'a') ||
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local), 'z' < *pcVar5
           )) && ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
                  *pcVar5 < 'A' ||
                  (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
                  'Z' < *pcVar5)))) &&
         (((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local), *pcVar5 < '0'
           || (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
              '9' < *pcVar5)) &&
          (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)full_name_local),
          pMVar2 = proto_local, pMVar1 = local_28, *pcVar5 != '_')))) {
        std::operator+(&local_a0,"\"",full_name_local);
        std::operator+(&local_80,&local_a0,"\" is not a valid identifier.");
        AddError(this,(string *)pMVar2,pMVar1,NAME,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Missing name.",&local_49);
    AddError(this,(string *)pMVar2,pMVar1,NAME,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateSymbolName(
    const string& name, const string& full_name, const Message& proto) {
  if (name.empty()) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
             "Missing name.");
  } else {
    for (int i = 0; i < name.size(); i++) {
      // I don't trust isalnum() due to locales.  :(
      if ((name[i] < 'a' || 'z' < name[i]) &&
          (name[i] < 'A' || 'Z' < name[i]) &&
          (name[i] < '0' || '9' < name[i]) &&
          (name[i] != '_')) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + name + "\" is not a valid identifier.");
      }
    }
  }
}